

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

RequestDsl * __thiscall RequestDsl::header(RequestDsl *this,string *name,string *value)

{
  undefined1 local_58 [8];
  HeaderItem item;
  
  std::__cxx11::string::string((string *)local_58,(string *)name);
  std::__cxx11::string::string((string *)(item.name.field_2._M_local_buf + 8),(string *)value);
  std::vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>::
  push_back(&(this->request).headers,(value_type *)local_58);
  httpparser::Request::HeaderItem::~HeaderItem((HeaderItem *)local_58);
  return this;
}

Assistant:

RequestDsl &header(const std::string &name, const std::string &value)
    {
        httpparser::Request::HeaderItem item = {name, value};
        request.headers.push_back(item);
        return *this; 
    }